

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Label::draw(Label *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  Theme *pTVar6;
  undefined8 uVar7;
  long *in_RDI;
  float fVar8;
  float fVar9;
  undefined4 in_XMM1_Da;
  ALLEGRO_COLOR fg;
  SaveState state;
  Theme *theme;
  undefined8 in_stack_fffffffffffffb48;
  int iVar11;
  ALLEGRO_FONT *pAVar10;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 local_428;
  undefined4 uStack_420;
  
  iVar11 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  pTVar6 = Dialog::get_theme((Dialog *)in_RDI[3]);
  anon_unknown.dwarf_7d88::SaveState::SaveState
            ((SaveState *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),iVar11);
  uVar1 = (pTVar6->fg).r;
  uVar2 = (pTVar6->fg).b;
  bVar5 = (**(code **)(*in_RDI + 0x80))();
  local_428 = uVar1;
  uStack_420 = uVar2;
  if ((bVar5 & 1) != 0) {
    local_428 = al_map_rgb(0x40,0x40);
    uStack_420 = in_XMM1_Da;
  }
  al_set_blender(0,1,3);
  if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
    pAVar10 = pTVar6->font;
    fVar8 = (float)(int)in_RDI[4];
    fVar9 = (float)*(int *)((long)in_RDI + 0x24);
    uVar7 = std::__cxx11::string::c_str();
    al_draw_text(local_428,uStack_420,fVar8,fVar9,pAVar10,0,uVar7);
  }
  else {
    pAVar10 = pTVar6->font;
    lVar3 = in_RDI[4];
    lVar4 = in_RDI[5];
    iVar11 = *(int *)((long)in_RDI + 0x24);
    uVar7 = std::__cxx11::string::c_str();
    al_draw_text(local_428,uStack_420,
                 (float)((1 - ((int)lVar3 + 1 + (int)lVar4 >> 0x1f)) + (int)lVar3 + (int)lVar4 >> 1)
                 ,(float)iVar11,pAVar10,1,uVar7);
  }
  anon_unknown.dwarf_7d88::SaveState::~SaveState((SaveState *)0x10c1fe);
  return;
}

Assistant:

void Label::draw()
{
   const Theme & theme = this->dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR fg = theme.fg;

   if (is_disabled()) {
      fg = al_map_rgb(64, 64, 64);
   }

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   if (centred) {
      al_draw_text(theme.font, fg, (this->x1 + this->x2 + 1)/2,
         this->y1, ALLEGRO_ALIGN_CENTRE, this->text.c_str());
   }
   else {
      al_draw_text(theme.font, fg, this->x1, this->y1, 0, this->text.c_str());
   }
}